

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_tag
          (version_parser *this,string *out,
          vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
          *out_identifiers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  token_stream *ptVar2;
  char *pcVar3;
  size_type sVar4;
  errc eVar5;
  from_chars_result fVar6;
  string identifier;
  string result;
  string local_a0;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  string *local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  paVar1 = &local_a0.field_2;
  local_60 = out;
  do {
    if (local_78 != 0) {
      std::__cxx11::string::push_back((char)&local_80);
    }
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    fVar6 = parse_prerelease_identifier(this,&local_a0);
    pcVar3 = fVar6.super_from_chars_result.ptr;
    eVar5 = fVar6.super_from_chars_result.ec;
    if (eVar5 != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001038be;
    }
    std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
    if (local_a0._M_string_length == 0) {
      local_58._0_4_ = numeric;
    }
    else {
      sVar4 = 0;
      do {
        local_58._0_4_ = alphanumeric;
        if ((local_a0._M_dataplus._M_p[sVar4] == 0x2d) ||
           (0xe5 < (byte)((local_a0._M_dataplus._M_p[sVar4] & 0xdfU) + 0xa5))) goto LAB_00103805;
        sVar4 = sVar4 + 1;
      } while (local_a0._M_string_length != sVar4);
      local_58._0_4_ = numeric;
    }
LAB_00103805:
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    std::
    vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
    ::emplace_back<semver::detail::prerelease_identifier>
              (out_identifiers,(prerelease_identifier *)local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    ptVar2 = this->stream;
    if ((ptVar2->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_start[ptVar2->current].type != dot) {
      std::__cxx11::string::_M_assign((string *)local_60);
      pcVar3 = (this->stream->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start[this->stream->current].lexeme;
      eVar5 = 0;
LAB_001038be:
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      fVar6.super_from_chars_result.ec = eVar5;
      fVar6.super_from_chars_result.ptr = pcVar3;
      fVar6.super_from_chars_result._12_4_ = 0;
      return (from_chars_result)fVar6.super_from_chars_result;
    }
    ptVar2->current = ptVar2->current + 1;
  } while( true );
}

Assistant:

parse_prerelease_tag(std::string& out, std::vector<detail::prerelease_identifier>& out_identifiers) {
    std::string result;

    do {
      if (!result.empty()) {
        result.push_back('.');
      }

      std::string identifier;
      if (const auto res = parse_prerelease_identifier(identifier); !res) {
        return res;
      }

      result.append(identifier);
      out_identifiers.push_back(make_prerelease_identifier(identifier));

    } while (stream.advanceIfMatch(token_type::dot));

    out = result;
    return success(stream.peek().lexeme);
  }